

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# help.cpp
# Opt level: O0

bool pstore::command_line::details::has_switches(option *self,options_container *all)

{
  bool bVar1;
  const_iterator __first;
  const_iterator __last;
  options_container *all_local;
  option *self_local;
  
  __first = std::
            begin<std::__cxx11::list<pstore::command_line::option*,std::allocator<pstore::command_line::option*>>>
                      (all);
  __last = std::
           end<std::__cxx11::list<pstore::command_line::option*,std::allocator<pstore::command_line::option*>>>
                     (all);
  bVar1 = std::
          any_of<std::_List_const_iterator<pstore::command_line::option*>,pstore::command_line::details::has_switches(pstore::command_line::option_const*,std::__cxx11::list<pstore::command_line::option*,std::allocator<pstore::command_line::option*>>const&)::__0>
                    ((_List_const_iterator<pstore::command_line::option_*>)__first._M_node,
                     (_List_const_iterator<pstore::command_line::option_*>)__last._M_node,
                     (anon_class_8_1_89917c4a_for__M_pred)self);
  return bVar1;
}

Assistant:

bool has_switches (option const * const self,
                                   option::options_container const & all) {
                    return std::any_of (
                        std::begin (all), std::end (all), [self] (option const * const op) {
                            return op != self && !op->is_alias () && !op->is_positional ();
                        });
                }